

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O3

int __thiscall
crnlib::dynamic_string::deserialize
          (dynamic_string *this,void *pBuf,uint buf_size,bool little_endian)

{
  uint buf_left;
  uint uVar1;
  int iVar2;
  byte bVar3;
  
  iVar2 = -1;
  if (1 < buf_size) {
    if (little_endian) {
      uVar1 = (uint)*pBuf;
      bVar3 = (byte)(*pBuf >> 8);
    }
    else {
      bVar3 = *pBuf;
      uVar1 = (uint)*(byte *)((long)pBuf + 1);
    }
    uVar1 = uVar1 & 0xff | (uint)bVar3 << 8;
    if (uVar1 <= buf_size - 2) {
      set_from_buf(this,(void *)((long)pBuf + 2),uVar1);
      iVar2 = uVar1 + 2;
    }
  }
  return iVar2;
}

Assistant:

int dynamic_string::deserialize(const void* pBuf, uint buf_size, bool little_endian) {
  uint buf_left = buf_size;

  if (buf_left < sizeof(uint16))
    return -1;

  uint16 l;
  if (!utils::read_obj(l, pBuf, buf_left, little_endian))
    return -1;

  if (buf_left < l)
    return -1;

  set_from_buf(pBuf, l);

  buf_left -= l;

  return buf_size - buf_left;
}